

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall
Minisat::Solver::toDimacs(Solver *this,FILE *f,Clause *c,vec<int,_int> *map,Var *max)

{
  bool bVar1;
  Var VVar2;
  int i;
  ulong uVar3;
  char *pcVar4;
  lbool local_41;
  FILE *local_40;
  Var *local_38;
  
  local_40 = (FILE *)f;
  local_38 = max;
  bVar1 = satisfied(this,c);
  if (!bVar1) {
    for (uVar3 = 0; uVar3 < (uint)c->header >> 5; uVar3 = uVar3 + 1) {
      local_41 = value(this,(Lit)c[uVar3 + 1].header);
      bVar1 = lbool::operator!=(&local_41,l_False);
      if (bVar1) {
        pcVar4 = "-";
        if (((uint)c[uVar3 + 1].header & 1) == 0) {
          pcVar4 = "";
        }
        VVar2 = mapVar((int)c[uVar3 + 1].header >> 1,map,local_38);
        fprintf(local_40,"%s%d ",pcVar4,(ulong)(VVar2 + 1));
      }
    }
    fwrite("0\n",2,1,local_40);
  }
  return;
}

Assistant:

void Solver::toDimacs(FILE* f, Clause& c, vec<Var>& map, Var& max)
{
    if (satisfied(c)) return;

    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) != l_False)
            fprintf(f, "%s%d ", sign(c[i]) ? "-" : "", mapVar(var(c[i]), map, max)+1);
    fprintf(f, "0\n");
}